

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

char * basist::basis_get_texture_type_name(basis_texture_type tex_type)

{
  undefined4 in_EDI;
  char *local_8;
  
  switch(in_EDI) {
  case 0:
    local_8 = "2D";
    break;
  case 1:
    local_8 = "2D array";
    break;
  case 2:
    local_8 = "cubemap array";
    break;
  case 3:
    local_8 = "video";
    break;
  case 4:
    local_8 = "3D";
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2a9c,"const char *basist::basis_get_texture_type_name(basis_texture_type)");
  }
  return local_8;
}

Assistant:

const char* basis_get_texture_type_name(basis_texture_type tex_type)
	{
		switch (tex_type)
		{
		case cBASISTexType2D: return "2D";
		case cBASISTexType2DArray: return "2D array";
		case cBASISTexTypeCubemapArray: return "cubemap array";
		case cBASISTexTypeVideoFrames: return "video";
		case cBASISTexTypeVolume: return "3D";
		default:
			assert(0);
			BASISU_DEVEL_ERROR("basis_get_texture_type_name: Invalid tex_type\n");
			break;
		}
		return "";
	}